

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *display_format,char *display_format_max,float power)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  char *text_end;
  float w_full;
  float fVar5;
  float v_max_00;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2,w_full);
    fVar5 = *v_current_max;
    v_max_00 = fVar5;
    if ((v_min < v_max) && (v_max_00 = v_max, fVar5 <= v_max)) {
      v_max_00 = fVar5;
    }
    bVar3 = DragFloat("##min",v_current_min,v_speed,
                      (float)(~-(uint)(v_max <= v_min) & (uint)v_min |
                             -(uint)(v_max <= v_min) & 0xff7fffff),v_max_00,display_format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    fVar5 = *v_current_min;
    if (v_max <= v_min) {
      v_max = 3.4028235e+38;
    }
    else {
      fVar5 = (float)(~-(uint)(fVar5 <= v_min) & (uint)fVar5 | (uint)v_min & -(uint)(fVar5 <= v_min)
                     );
    }
    if (display_format_max != (char *)0x0) {
      display_format = display_format_max;
    }
    bVar4 = DragFloat("##max",v_current_max,v_speed,fVar5,v_max,display_format,power);
    bVar3 = bVar3 || bVar4;
    PopItemWidth();
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
    PopID();
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* display_format, const char* display_format_max, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2);

    bool value_changed = DragFloat("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), display_format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragFloat("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? FLT_MAX : v_max, display_format_max ? display_format_max : display_format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}